

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O0

uint32_t imageio::convertSINT(uint32_t rawBits,uint32_t sourceBits,uint32_t targetBits)

{
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  uint32_t result;
  uint targetValueMask;
  uint targetValueBits;
  uint targetSignBitIndex;
  uint sourceValue;
  uint sourceValueMask;
  uint sourceValueBits;
  bool sign;
  uint sourceSignMask;
  uint sourceSignBitIndex;
  uint local_34;
  
  if (in_ESI < 2 || 0x20 < in_ESI) {
    __assert_fail("sourceBits > 1 && sourceBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                  ,0x116,"uint32_t imageio::convertSINT(uint32_t, uint32_t, uint32_t)");
  }
  if (in_EDX < 2 || 0x20 < in_EDX) {
    __assert_fail("targetBits > 1 && targetBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                  ,0x117,"uint32_t imageio::convertSINT(uint32_t, uint32_t, uint32_t)");
  }
  local_34 = in_EDI & (1 << ((char)in_ESI - 1U & 0x1f)) - 1U;
  if (in_EDX < in_ESI) {
    local_34 = local_34 & (1 << ((char)in_EDX - 1U & 0x1f)) - 1U;
  }
  local_34 = local_34 |
             (uint)((in_EDI & 1 << ((char)in_ESI - 1U & 0x1f)) != 0) << ((char)in_EDX - 1U & 0x1f);
  return local_34;
}

Assistant:

[[nodiscard]] constexpr inline uint32_t convertSINT(uint32_t rawBits, uint32_t sourceBits, uint32_t targetBits) noexcept {
    assert(sourceBits > 1 && sourceBits <= 32);
    assert(targetBits > 1 && targetBits <= 32);

    const auto sourceSignBitIndex = sourceBits - 1u;
    const auto sourceSignMask = 1u << sourceSignBitIndex;
    const auto sign = (rawBits & sourceSignMask) != 0;
    const auto sourceValueBits = sourceBits - 1u;
    const auto sourceValueMask = (1u << sourceValueBits) - 1u;
    const auto sourceValue = rawBits & sourceValueMask;
    const auto targetSignBitIndex = targetBits - 1u;
    const auto targetValueBits = targetBits - 1u;
    const auto targetValueMask = (1u << targetValueBits) - 1u;

    uint32_t result = 0;
    result |= (sign ? 1u : 0u) << targetSignBitIndex;

    if (targetBits < sourceBits)
        result |= sourceValue & targetValueMask;
    else
        result |= sourceValue;

    return result;
}